

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O0

int check_matrix_entry(SUNMatrix A,realtype val,realtype tol)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint local_54;
  sunindextype NP;
  sunindextype i;
  sunindextype *indexptrs;
  realtype *Adata;
  int failure;
  realtype tol_local;
  realtype val_local;
  SUNMatrix A_local;
  
  Adata._4_4_ = 0;
  lVar1 = SUNSparseMatrix_Data(A);
  lVar2 = SUNSparseMatrix_IndexPointers(A);
  lVar3 = SUNSparseMatrix_NP(A);
  for (NP = 0; NP < *(long *)(lVar2 + lVar3 * 8); NP = NP + 1) {
    if (NAN(*(double *)(lVar1 + NP * 8))) {
      local_54 = 1;
    }
    else {
      local_54 = (uint)(tol < ABS(*(double *)(lVar1 + NP * 8) - val) / ABS(val));
    }
    Adata._4_4_ = local_54 + Adata._4_4_;
  }
  A_local._4_4_ = (uint)(0.0 < (double)Adata._4_4_);
  return A_local._4_4_;
}

Assistant:

int check_matrix_entry(SUNMatrix A, realtype val, realtype tol)
{
  int failure = 0;
  realtype *Adata;
  sunindextype *indexptrs;
  sunindextype i, NP;

  /* get data pointer */
  Adata = SUNSparseMatrix_Data(A);

  /* compare data */
  indexptrs = SUNSparseMatrix_IndexPointers(A);
  NP = SUNSparseMatrix_NP(A);
  for(i=0; i < indexptrs[NP]; i++){
    failure += FNEQ(Adata[i], val, tol);
  }

  if (failure > ZERO)
    return(1);
  else
    return(0);
}